

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::number::impl::NumberStringBuilder::getLastCodePoint(NumberStringBuilder *this)

{
  int iVar1;
  char16_t *pcVar2;
  uint local_20;
  int iStack_1c;
  uint16_t __c2;
  UChar32 cp;
  int32_t offset;
  NumberStringBuilder *this_local;
  
  if (this->fLength == 0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    iVar1 = this->fLength;
    pcVar2 = getCharPtr(this);
    iStack_1c = iVar1 + -1;
    if ((((pcVar2[(long)this->fZero + (long)iStack_1c] & 0xfc00U) == 0xdc00) && (0 < iStack_1c)) &&
       (pcVar2 = getCharPtr(this),
       (pcVar2[(long)this->fZero + (long)(iVar1 + -2)] & 0xfc00U) == 0xd800)) {
      iStack_1c = iVar1 + -2;
    }
    pcVar2 = getCharPtr(this);
    local_20 = (uint)(ushort)pcVar2[(long)this->fZero + (long)iStack_1c];
    if ((local_20 & 0xfffff800) == 0xd800) {
      if ((pcVar2[(long)this->fZero + (long)iStack_1c] & 0x400U) == 0) {
        if (iStack_1c + 1 != this->fLength) {
          pcVar2 = getCharPtr(this);
          if ((pcVar2[(long)this->fZero + (long)(iStack_1c + 1)] & 0xfc00U) == 0xdc00) {
            local_20 = local_20 * 0x400 +
                       (uint)(ushort)pcVar2[(long)this->fZero + (long)(iStack_1c + 1)] + 0xfca02400;
          }
        }
      }
      else if (0 < iStack_1c) {
        pcVar2 = getCharPtr(this);
        if ((pcVar2[(long)this->fZero + (long)(iStack_1c + -1)] & 0xfc00U) == 0xd800) {
          local_20 = (uint)(ushort)pcVar2[(long)this->fZero + (long)(iStack_1c + -1)] * 0x400 +
                     local_20 + 0xfca02400;
        }
      }
    }
    this_local._4_4_ = local_20;
  }
  return this_local._4_4_;
}

Assistant:

UChar32 NumberStringBuilder::getLastCodePoint() const {
    if (fLength == 0) {
        return -1;
    }
    int32_t offset = fLength;
    U16_BACK_1(getCharPtr() + fZero, 0, offset);
    UChar32 cp;
    U16_GET(getCharPtr() + fZero, 0, offset, fLength, cp);
    return cp;
}